

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O3

vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
* getPredefinedTransformations1M1Q<double>
            (vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
             *__return_storage_ptr__,Matrix<double,_6,_1,_0,_6,_1> *l1,
            Matrix<double,_6,_1,_0,_6,_1> *l2)

{
  long lVar1;
  double dVar2;
  iterator __position;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pCVar12;
  double *pdVar13;
  Matrix<double,_4,_4,_0,_4,_4> *pMVar14;
  iterator iVar15;
  PointerType ptr_1;
  PointerType ptr;
  byte bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined4 uVar19;
  undefined4 uVar20;
  undefined1 auVar21 [16];
  double dVar22;
  undefined1 auVar23 [16];
  RealScalar z_1;
  double dVar24;
  undefined1 auVar25 [16];
  RealScalar z_2;
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  double dVar29;
  double dVar30;
  double dVar32;
  undefined1 auVar31 [16];
  RealScalar z;
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  double dVar36;
  undefined1 auVar37 [16];
  Matrix<double,_4,_4,_0,_4,_4> TU1;
  Matrix<double,_4,_4,_0,_4,_4> TU2;
  Matrix<double,_3,_1,_0,_3,_1> ey;
  Matrix<double,_3,_1,_0,_3,_1> ex;
  Matrix<double,_4,_4,_0,_4,_4> Tu2;
  Matrix<double,_4,_4,_0,_4,_4> Tu1;
  Matrix<double,_6,_6,_0,_6,_6> TuL2;
  Matrix<double,_6,_6,_0,_6,_6> TuL1;
  Matrix<double,_4,_4,_0,_4,_4> TU;
  Matrix<double,_4,_4,_0,_4,_4> TU_B;
  Matrix<double,_3,_3,_0,_3,_3> U2;
  Matrix<double,_3,_3,_0,_3,_3> U1;
  double dStack_7a0;
  double local_798;
  undefined8 uStack_790;
  Matrix<double,_3,_3,_0,_3,_3> local_788;
  double dStack_740;
  double local_738;
  double dStack_730;
  double dStack_728;
  double local_720;
  undefined8 uStack_718;
  undefined8 local_710;
  double local_708;
  double dStack_700;
  undefined1 local_6f8 [16];
  double local_6e8;
  double dStack_6e0;
  double local_6d8;
  double dStack_6d0;
  double local_6c8;
  undefined8 uStack_6c0;
  double local_6b8;
  double local_6b0;
  double local_6a8;
  double local_6a0;
  double local_698 [2];
  Scalar local_688;
  double adStack_680 [16];
  undefined8 uStack_600;
  double local_5f8;
  undefined8 uStack_5f0;
  double local_5e8;
  double dStack_5e0;
  double local_5d8;
  undefined8 uStack_5d0;
  double local_5c8;
  double dStack_5c0;
  double local_5b8;
  double dStack_5b0;
  double local_5a8;
  undefined8 uStack_5a0;
  undefined1 local_598 [16];
  double local_588;
  double dStack_580;
  double local_578;
  double dStack_570;
  Matrix<double,_3,_1,_0,_3,_1> local_568;
  Matrix<double,_3,_1,_0,_3,_1> local_550;
  double local_538 [28];
  undefined1 local_458 [16];
  double local_448;
  ulong local_440;
  undefined8 local_438;
  undefined8 uStack_430;
  double dStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  double dStack_408;
  double local_400;
  double local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  double local_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  double dStack_398;
  undefined8 local_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  double local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  double dStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  ulong local_320;
  double local_318;
  ulong uStack_310;
  double dStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  double dStack_2e8;
  double local_2e0;
  double local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  double local_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  double dStack_278;
  undefined8 local_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  double local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  double dStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  Matrix<double,_3,_1,_0,_3,_1> local_1f8;
  undefined1 local_1d8 [16];
  double local_1c8;
  Matrix<double,_4,_4,_0,_4,_4> local_1b8;
  Matrix<double,_4,_4,_0,_4,_4> local_138;
  double local_b0;
  double dStack_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double dStack_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  
  bVar16 = 0;
  dVar26 = (l1->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0];
  dVar36 = (l1->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [1];
  dVar22 = (l1->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [2];
  dVar24 = (l1->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [3];
  dVar6 = (l2->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  dVar7 = (l2->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  dVar2 = (l2->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  dVar29 = (l2->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [3];
  dVar27 = (l1->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [5] * dVar36 -
           (l1->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [4] * dVar22;
  dVar33 = dVar22 * dVar24 -
           (l1->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [5] * dVar26;
  local_448 = (l1->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
              array[4] * dVar26 - dVar36 * dVar24;
  dVar30 = (l2->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [5] * dVar7 -
           (l2->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [4] * dVar2;
  dVar32 = dVar2 * dVar29 -
           (l2->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [5] * dVar6;
  dVar29 = (l2->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [4] * dVar6 - dVar7 * dVar29;
  dVar24 = dVar22 * local_448 + dVar33 * dVar36 + dVar27 * dVar26;
  dVar27 = dVar27 - dVar24 * dVar26;
  dVar33 = dVar33 - dVar24 * dVar36;
  uVar19 = SUB84(dVar33,0);
  uVar20 = (undefined4)((ulong)dVar33 >> 0x20);
  local_448 = local_448 - dVar22 * dVar24;
  dVar22 = dVar2 * dVar29 + dVar32 * dVar7 + dVar30 * dVar6;
  dVar30 = dVar30 - dVar22 * dVar6;
  dVar32 = dVar32 - dVar22 * dVar7;
  dVar29 = dVar29 - dVar2 * dVar22;
  local_538[0x10] = 1.0;
  local_538[0x11] = 0.0;
  local_538[0x12] = 0.0;
  local_538[0x13] = 0.0;
  local_538[0x14] = 0.0;
  local_538[0x15] = 1.0;
  local_538[0x16] = 0.0;
  local_538[0x17] = 0.0;
  local_538[0x18] = 0.0;
  local_538[0x19] = 0.0;
  local_538[0x1a] = 1.0;
  local_538[0x1b] = 0.0;
  local_440 = 0x3ff0000000000000;
  local_538[0] = 1.0;
  local_538[1] = 0.0;
  local_538[2] = 0.0;
  local_538[3] = 0.0;
  local_538[4] = 0.0;
  local_538[5] = 1.0;
  local_538[6] = 0.0;
  local_538[7] = 0.0;
  local_538[8] = 0.0;
  local_538[9] = 0.0;
  local_538[10] = 1.0;
  local_538[0xb] = 0.0;
  local_538[0xf] = 1.0;
  local_458._8_4_ = uVar19;
  local_458._0_8_ = dVar27;
  local_458._12_4_ = uVar20;
  local_318 = 1.0;
  uStack_310 = 0;
  dStack_308 = 0.0;
  local_300 = 0;
  uStack_2f8 = 0;
  local_2f0 = 0;
  dStack_2e8 = 0.0;
  local_2e0 = 1.0;
  local_2d8 = 0.0;
  uStack_2d0 = 0;
  local_2c8 = 0;
  uStack_2c0 = 0;
  local_2b8 = 0;
  uStack_2b0 = 0;
  local_2a8 = 1.0;
  local_2a0 = 0;
  uStack_298 = 0;
  local_290 = 0;
  uStack_288 = 0;
  local_280 = 0;
  dStack_278 = 0.0;
  local_270 = 0x3ff0000000000000;
  local_268 = 0;
  uStack_260 = 0;
  local_258 = 0;
  uStack_250 = 0;
  local_248 = 0.0;
  uStack_240 = 0;
  local_238 = 0x3ff0000000000000;
  local_210 = 0;
  uStack_208 = 0;
  local_220 = 0;
  dStack_218 = 0.0;
  local_230 = 0;
  uStack_228 = 0;
  local_200 = 0x3ff0000000000000;
  local_438 = 1.0;
  uStack_430 = 0.0;
  dStack_428 = 0.0;
  local_420 = 0;
  uStack_418 = 0;
  local_410 = 0;
  dStack_408 = 0.0;
  local_400 = 1.0;
  local_3f8 = 0.0;
  uStack_3f0 = 0;
  local_3e8 = 0;
  uStack_3e0 = 0;
  local_3d8 = 0;
  uStack_3d0 = 0;
  local_3c8 = 1.0;
  local_3c0 = 0;
  uStack_3b8 = 0;
  local_3b0 = 0;
  uStack_3a8 = 0;
  local_3a0 = 0;
  dStack_398 = 0.0;
  local_390 = 0x3ff0000000000000;
  local_388 = 0;
  uStack_380 = 0;
  local_378 = 0;
  uStack_370 = 0;
  local_368 = 0.0;
  uStack_360 = 0;
  local_358 = 0x3ff0000000000000;
  local_330 = 0;
  uStack_328 = 0;
  local_340 = 0;
  dStack_338 = 0.0;
  local_350 = 0;
  uStack_348 = 0;
  local_320 = 0x3ff0000000000000;
  local_1d8._8_4_ = uVar19;
  local_1d8._0_8_ = dVar27;
  local_1d8._12_4_ = uVar20;
  local_538[0xc] = dVar30;
  local_538[0xd] = dVar32;
  local_538[0xe] = dVar29;
  local_1c8 = local_448;
  getSkew<double>(&local_788,(Matrix<double,_3,_1,_0,_3,_1> *)local_1d8);
  lVar11 = 0x10;
  do {
    *(ulong *)((long)&local_320 + lVar11 * 2) =
         *(ulong *)((long)&local_798 + lVar11) ^ 0x8000000000000000;
    uVar8 = *(ulong *)((long)local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                             m_storage.m_data.array + lVar11);
    *(ulong *)((long)&local_318 + lVar11 * 2) =
         *(ulong *)((long)&uStack_790 + lVar11) ^ 0x8000000000000000;
    *(ulong *)((long)&uStack_310 + lVar11 * 2) = uVar8 ^ 0x8000000000000000;
    lVar11 = lVar11 + 0x18;
  } while (lVar11 != 0x58);
  local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       dVar30;
  local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       dVar32;
  local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       dVar29;
  getSkew<double>(&local_788,&local_1f8);
  lVar11 = 0x10;
  do {
    *(ulong *)((long)&local_440 + lVar11 * 2) =
         *(ulong *)((long)&local_798 + lVar11) ^ 0x8000000000000000;
    uVar9 = *(uint *)((long)&uStack_790 + lVar11 + 4);
    uVar19 = *(undefined4 *)
              ((long)local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array + lVar11);
    uVar10 = *(uint *)((long)local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                             m_storage.m_data.array + lVar11 + 4);
    lVar1 = lVar11 * 2;
    *(undefined4 *)((long)&local_438 + lVar1) = *(undefined4 *)((long)&uStack_790 + lVar11);
    *(uint *)((long)&local_438 + lVar1 + 4) = uVar9 ^ 0x80000000;
    *(undefined4 *)((long)&uStack_430 + lVar1) = uVar19;
    *(uint *)((long)&uStack_430 + lVar1 + 4) = uVar10 ^ 0x80000000;
    lVar11 = lVar11 + 0x18;
  } while (lVar11 != 0x58);
  auVar35 = *(undefined1 (*) [16])
             (l1->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array;
  dVar22 = auVar35._0_8_;
  local_5b8 = dVar22 * local_318;
  dStack_5b0 = dVar22 * (double)uStack_310;
  local_708 = (l1->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
              array[1];
  dStack_700 = (l1->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
               array[2];
  local_5e8 = local_708 * dStack_2e8;
  dStack_5e0 = local_708 * local_2e0;
  local_5d8 = (l1->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
              array[2];
  local_5a8 = (l1->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
              array[3];
  local_598 = *(undefined1 (*) [16])
               ((l1->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
                array + 4);
  dVar27 = local_598._8_8_;
  local_6d8 = (l2->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
              array[0];
  dStack_6d0 = (l2->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
               array[1];
  local_588 = local_6d8 * local_438;
  dStack_580 = local_6d8 * uStack_430;
  local_578 = (l2->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
              array[1];
  dStack_570 = (l2->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
               array[2];
  local_5c8 = local_578 * dStack_408;
  dStack_5c0 = local_578 * local_400;
  local_6e8 = (l2->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
              array[4];
  dVar2 = (l2->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  local_6f8._8_4_ = auVar35._8_4_;
  local_6f8._0_8_ = dVar22 * dStack_308;
  local_6f8._12_4_ = auVar35._12_4_;
  local_708 = local_708 * local_2d8;
  auVar35._8_4_ = local_598._8_4_;
  auVar35._0_8_ = dVar27;
  auVar35._12_4_ = local_598._12_4_;
  local_6c8 = dStack_218 * dVar27;
  uStack_6c0 = 0;
  uStack_5d0 = 0;
  local_698[1] = local_2a8 * local_5d8;
  uStack_5a0 = 0;
  local_698[0] = dStack_278 * local_5a8;
  local_6d8 = local_6d8 * dStack_428;
  local_6a0 = local_248 * local_598._0_8_;
  local_578 = local_578 * local_3f8;
  local_798 = dStack_338 * dVar2;
  uStack_790 = 0;
  adStack_680[0xf] =
       (l2->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2];
  uStack_600 = 0;
  local_6a8 = local_3c8 * adStack_680[0xf];
  local_5f8 = (l2->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
              array[3];
  uStack_5f0 = 0;
  local_6b0 = dStack_398 * local_5f8;
  local_6b8 = local_368 * local_6e8;
  local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_550;
  local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       4.94065645841247e-324;
  local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       4.94065645841247e-324;
  local_550.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       1.0;
  local_688 = 0.0;
  dStack_6e0 = dVar2;
  pCVar12 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                      ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_788,
                       &local_688);
  local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       0.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
            (pCVar12,(Scalar *)&local_1b8);
  if (((long)local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[3] +
       (long)local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[1] == 3) &&
     (local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [2] == 4.94065645841247e-324)) {
    local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
         = (double)&local_568;
    local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]
         = 0.0;
    local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2]
         = 4.94065645841247e-324;
    local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3]
         = 4.94065645841247e-324;
    local_568.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = 0.0;
    local_688 = 1.0;
    pCVar12 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                        ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_788,
                         &local_688);
    local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
         = 0.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
              (pCVar12,(Scalar *)&local_1b8);
    if (((long)local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[3] +
         (long)local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[1] == 3) &&
       (local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] == 4.94065645841247e-324)) {
      dStack_7a0 = auVar35._8_8_;
      local_58 = dVar27 * 0.0 +
                 (double)local_598._0_8_ * 0.0 +
                 local_5a8 * 0.0 + local_5d8 * 0.0 + local_5b8 + local_5e8;
      local_40 = dStack_7a0 * 0.0 +
                 (double)local_598._0_8_ * 0.0 +
                 local_5a8 * 0.0 + local_5d8 * 0.0 + dStack_5b0 + dStack_5e0;
      local_a0 = local_6e8 * 0.0 + local_5f8 * 0.0 + adStack_680[0xf] * 0.0 + local_588 + local_5c8;
      dStack_6e0 = local_6e8 * 0.0 +
                   local_5f8 * 0.0 + adStack_680[0xf] * 0.0 + dStack_580 + dStack_5c0;
      local_6e8 = local_a0;
      local_6c8 = local_6c8 +
                  (double)local_6f8._0_8_ + local_708 + local_698[1] + local_698[0] + local_6a0;
      local_6d8 = local_6d8 + local_578 + local_6a8 + local_6b0 + local_6b8;
      auVar31._0_8_ =
           local_568.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1] * local_6c8 -
           local_40 *
           local_568.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2];
      auVar31._8_8_ =
           local_568.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2] * local_58 -
           local_6c8 *
           local_568.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0];
      local_6f8._8_4_ =
           SUB84(local_568.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2],0);
      local_6f8._0_8_ =
           -local_568.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[1];
      local_6f8._12_4_ =
           (uint)((ulong)local_568.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                         m_storage.m_data.array[2] >> 0x20) ^ 0x80000000;
      local_38 = local_568.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0] * local_40 -
                 local_58 *
                 local_568.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1];
      auVar28._0_8_ =
           local_6c8 *
           local_550.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1] -
           local_40 *
           local_550.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2];
      auVar28._8_8_ =
           local_58 *
           local_550.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2] -
           local_6c8 *
           local_550.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0];
      dVar22 = local_40 *
               local_550.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0] -
               local_58 *
               local_550.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[1];
      dVar33 = local_38 * local_38 + auVar31._8_8_ * auVar31._8_8_ + auVar31._0_8_ * auVar31._0_8_;
      dVar27 = dVar22 * dVar22 + auVar28._8_8_ * auVar28._8_8_ + auVar28._0_8_ * auVar28._0_8_;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = dVar33;
      auVar35 = sqrtpd(auVar34,auVar34);
      auVar37._8_8_ = 0;
      auVar37._0_8_ = dVar27;
      auVar34 = sqrtpd(auVar37,auVar37);
      dVar26 = auVar35._0_8_;
      dVar36 = auVar34._0_8_;
      local_708 = -local_550.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[1];
      dStack_700 = -local_550.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                    .m_data.array[2];
      if (dVar26 <= dVar36) {
        local_38 = dVar22;
        auVar31 = auVar28;
        if (0.0 < dVar27) {
          auVar5._8_8_ = dVar36;
          auVar5._0_8_ = dVar36;
          auVar31 = divpd(auVar28,auVar5);
          local_38 = dVar22 / dVar36;
        }
      }
      else if (0.0 < dVar33) {
        auVar4._8_8_ = dVar26;
        auVar4._0_8_ = dVar26;
        auVar31 = divpd(auVar31,auVar4);
        local_38 = local_38 / dVar26;
      }
      local_a0 = dVar2 * 0.0 + local_a0;
      local_88 = dVar2 * 0.0 + dStack_6e0;
      local_70 = local_798 + local_6d8;
      pdVar13 = &local_58;
      local_68 = auVar31._0_8_;
      local_50 = auVar31._8_8_;
      dStack_60 = local_40 * local_38 - local_50 * local_6c8;
      local_48 = local_6c8 * local_68 - local_38 * local_58;
      local_30 = local_50 * local_58 - local_68 * local_40;
      local_28 = local_6c8;
      local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = 1.0;
      local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [1] = 0.0;
      local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [2] = 0.0;
      local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [3] = 0.0;
      local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [4] = 0.0;
      local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [5] = 1.0;
      local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [6] = 0.0;
      local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [7] = 0.0;
      local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [8] = 0.0;
      dStack_740 = 0.0;
      local_738 = 1.0;
      dStack_730 = 0.0;
      dStack_728 = 0.0;
      local_720 = 0.0;
      uStack_718 = 0;
      local_710 = 0x3ff0000000000000;
      lVar11 = 0x10;
      do {
        dVar22 = pdVar13[-1];
        *(double *)((long)&local_798 + lVar11) = pdVar13[-2];
        *(double *)((long)&uStack_790 + lVar11) = dVar22;
        *(double *)
         ((long)local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array + lVar11) = *pdVar13;
        pdVar13 = pdVar13 + 3;
        lVar11 = lVar11 + 0x20;
      } while (lVar11 != 0x70);
      auVar21._0_8_ =
           local_568.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1] * local_70 +
           -local_568.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[2] * local_88;
      auVar21._8_8_ =
           local_568.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2] * local_a0 +
           -local_568.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[0] * local_70;
      local_80 = local_568.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0] * local_88 +
                 -local_568.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[1] * local_a0;
      auVar17._0_8_ =
           local_550.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1] * local_70 +
           local_88 *
           -local_550.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[2];
      auVar17._8_8_ =
           local_550.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2] * local_a0 +
           local_70 *
           -local_550.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[0];
      dVar22 = local_550.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0] * local_88 +
               -local_550.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[1] * local_a0;
      dVar2 = local_80 * local_80 + auVar21._8_8_ * auVar21._8_8_ + auVar21._0_8_ * auVar21._0_8_;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = dVar2;
      auVar35 = sqrtpd(auVar23,auVar23);
      dVar26 = dVar22 * dVar22 + auVar17._8_8_ * auVar17._8_8_ + auVar17._0_8_ * auVar17._0_8_;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = dVar26;
      auVar31 = sqrtpd(auVar25,auVar25);
      dVar27 = auVar35._0_8_;
      dVar33 = auVar31._0_8_;
      if (dVar27 <= dVar33) {
        auVar21 = auVar17;
        local_80 = dVar22;
        if (0.0 < dVar26) {
          auVar3._8_8_ = dVar33;
          auVar3._0_8_ = dVar33;
          auVar21 = divpd(auVar17,auVar3);
          local_80 = dVar22 / dVar33;
        }
      }
      else if (0.0 < dVar2) {
        auVar18._8_8_ = dVar27;
        auVar18._0_8_ = dVar27;
        auVar21 = divpd(auVar21,auVar18);
        local_80 = local_80 / dVar27;
      }
      pdVar13 = &local_a0;
      local_b0 = auVar21._0_8_;
      local_98 = auVar21._8_8_;
      dStack_a8 = local_88 * local_80 - local_98 * local_70;
      local_90 = local_70 * local_b0 - local_80 * local_a0;
      local_78 = local_98 * local_a0 - local_b0 * local_88;
      local_688 = 1.0;
      adStack_680[0] = 0.0;
      adStack_680[1] = 0.0;
      adStack_680[2] = 0.0;
      adStack_680[3] = 0.0;
      adStack_680[4] = 1.0;
      adStack_680[5] = 0.0;
      adStack_680[6] = 0.0;
      adStack_680[7] = 0.0;
      adStack_680[8] = 0.0;
      adStack_680[9] = 1.0;
      adStack_680[10] = 0.0;
      adStack_680[0xb] = 0.0;
      adStack_680[0xc] = 0.0;
      adStack_680[0xd] = 0.0;
      adStack_680[0xe] = 1.0;
      lVar11 = 0x10;
      do {
        dVar22 = pdVar13[-1];
        *(double *)((long)local_698 + lVar11) = pdVar13[-2];
        *(double *)((long)local_698 + lVar11 + 8) = dVar22;
        *(double *)((long)&local_688 + lVar11) = *pdVar13;
        pdVar13 = pdVar13 + 3;
        lVar11 = lVar11 + 0x20;
      } while (lVar11 != 0x70);
      lVar11 = 0;
      do {
        dVar22 = *(double *)((long)local_538 + lVar11 + 0x80);
        dVar2 = *(double *)((long)local_538 + lVar11 + 0x88);
        dVar27 = *(double *)((long)local_538 + lVar11 + 0x90);
        dVar33 = *(double *)((long)local_538 + lVar11 + 0x98);
        *(double *)
         ((long)local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array + lVar11) =
             dStack_728 * dVar33 +
             local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8] * dVar27 +
             local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4] * dVar2 +
             local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[0] * dVar22;
        *(double *)
         ((long)local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array + lVar11 + 8) =
             local_720 * dVar33 +
             dStack_740 * dVar27 +
             local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[5] * dVar2 +
             local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[1] * dVar22;
        *(double *)
         ((long)local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array + lVar11 + 0x10) =
             dVar33 * 0.0 +
             dVar27 * local_738 +
             dVar2 * local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[6] +
             dVar22 * local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[2];
        *(double *)
         ((long)local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array + lVar11 + 0x18) =
             dVar33 * 1.0 +
             dVar27 * dStack_730 +
             dVar2 * local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[7] +
             dVar22 * local_788.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[3];
        lVar11 = lVar11 + 0x20;
      } while (lVar11 != 0x80);
      lVar11 = 0;
      do {
        dVar22 = *(double *)((long)local_538 + lVar11);
        dVar2 = *(double *)((long)local_538 + lVar11 + 8);
        dVar27 = *(double *)((long)local_538 + lVar11 + 0x10);
        dVar33 = *(double *)((long)local_538 + lVar11 + 0x18);
        *(double *)
         ((long)local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array + lVar11) =
             adStack_680[0xb] * dVar33 +
             adStack_680[7] * dVar27 + adStack_680[3] * dVar2 + local_688 * dVar22;
        *(double *)
         ((long)local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array + lVar11 + 8) =
             adStack_680[0xc] * dVar33 +
             adStack_680[8] * dVar27 + adStack_680[4] * dVar2 + adStack_680[0] * dVar22;
        *(double *)
         ((long)local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array + lVar11 + 0x10) =
             dVar33 * 0.0 +
             dVar27 * adStack_680[9] + dVar2 * adStack_680[5] + dVar22 * adStack_680[1];
        *(double *)
         ((long)local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array + lVar11 + 0x18) =
             dVar33 * 1.0 +
             dVar27 * adStack_680[10] + dVar2 * adStack_680[6] + dVar22 * adStack_680[2];
        lVar11 = lVar11 + 0x20;
      } while (lVar11 != 0x80);
      (__return_storage_ptr__->
      super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>::
      _M_realloc_insert<Eigen::Matrix<double,4,4,0,4,4>const&>
                ((vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
                  *)__return_storage_ptr__,(iterator)0x0,&local_1b8);
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
        ::_M_realloc_insert<Eigen::Matrix<double,4,4,0,4,4>const&>
                  ((vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
                    *)__return_storage_ptr__,__position,&local_138);
      }
      else {
        pMVar14 = &local_138;
        iVar15._M_current = __position._M_current;
        for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
          ((iVar15._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
          m_storage.m_data.array[0] =
               (pMVar14->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[0];
          pMVar14 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar14 + ((ulong)bVar16 * -2 + 1) * 8);
          iVar15._M_current =
               (Matrix<double,_4,_4,_0,_4,_4> *)
               ((long)iVar15._M_current + ((ulong)bVar16 * -2 + 1) * 8);
        }
        (__return_storage_ptr__->
        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      return __return_storage_ptr__;
    }
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 1>>::finished() [MatrixType = Eigen::Matrix<double, 3, 1>]"
               );
}

Assistant:

vector<Matrix<floatPrec, 4,4>> getPredefinedTransformations1M1Q(Matrix<floatPrec, 6,1> l1, Matrix<floatPrec, 6,1> l2){

	// get closest point --in the line-- to the origin
	Eigen::Matrix<floatPrec,3,1> dir1 = l1.head(3), m1 = l1.tail(3);
	Eigen::Matrix<floatPrec,3,1> dir2 = l2.head(3), m2 = l2.tail(3);
	Eigen::Matrix<floatPrec,3,1> x1 = dir1.cross(m1);
	Eigen::Matrix<floatPrec,3,1> x2 = dir2.cross(m2);
	
	// get transform to translate frames to the line
	Eigen::Matrix<floatPrec,3,1> u1 = x1 - x1.transpose()*dir1*dir1;
	Eigen::Matrix<floatPrec,3,1> u2 = x2 - x2.transpose()*dir2*dir2;
	Eigen::Matrix<floatPrec,4,4> Tu1 = Eigen::Matrix<floatPrec,4,4>::Identity(), Tu2 = Eigen::Matrix<floatPrec,4,4>::Identity();
	Tu1.topRightCorner(3,1) = u1;
	Tu2.topRightCorner(3,1) = u2;
	Eigen::Matrix<floatPrec,6,6> TuL1 = Eigen::Matrix<floatPrec,6,6>::Identity(), TuL2 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TuL1.block(3,0,3,3) = -getSkew<floatPrec>(u1);
	TuL2.block(3,0,3,3) = -getSkew<floatPrec>(u2);

	// transform point and line to new ref
	Eigen::Matrix<floatPrec,6,1> lu1 = TuL1*l1;
	Eigen::Matrix<floatPrec,6,1> lu2 = TuL2*l2;

	//align z axis with line direction
	Eigen::Matrix<floatPrec,3,1> U1_3 = lu1.head(3), U2_3 = lu2.head(3);
	Eigen::Matrix<floatPrec,3,1> ex, ey;
	ex << 1,0,0; ey << 0,1,0;
	Eigen::Matrix<floatPrec,3,1> U1_1, U2_1;
	// frame A
	Eigen::Matrix<floatPrec,3,1> U1_3M = ey.cross(U1_3);
	Eigen::Matrix<floatPrec,3,1> U1_3P = ex.cross(U1_3);
	if(U1_3M.norm() > U1_3P.norm())
		U1_1 = U1_3M.normalized();
	else
		U1_1 = U1_3P.normalized();
	Eigen::Matrix<floatPrec,3,3> U1;
	U1.row(0) = U1_1.transpose();
	U1.row(1) = U1_3.cross(U1_1).transpose();
	U1.row(2) = U1_3.transpose();
	Eigen::Matrix<floatPrec,4,4> TU1 = Eigen::Matrix<floatPrec,4,4>::Identity();
	TU1.topLeftCorner(3,3) = U1;
	Eigen::Matrix<floatPrec,6,6> TUL1 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TUL1.topLeftCorner(3,3) = U1; TUL1.block(3,3,3,3) = U1;
	// frame B
	Eigen::Matrix<floatPrec,3,1> U2_3M = ey.cross(U2_3);
	Eigen::Matrix<floatPrec,3,1> U2_3P = ex.cross(U2_3);
	if(U2_3M.norm() > U2_3P.norm())
		U2_1 = U2_3M.normalized();
	else
		U2_1 = U2_3P.normalized();
	Eigen::Matrix<floatPrec,3,3> U2;
	U2.row(0) = U2_1.transpose();
	U2.row(1) = U2_3.cross(U2_1).transpose();
	U2.row(2) = U2_3.transpose();
	Eigen::Matrix<floatPrec,4,4> TU2 = Eigen::Matrix<floatPrec,4,4>::Identity();
	TU2.topLeftCorner(3,3) = U2;
	Eigen::Matrix<floatPrec,6,6> TUL2 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TUL2.topLeftCorner(3,3) = U2; TUL2.block(3,3,3,3) = U2;

	Eigen::Matrix<floatPrec,4,4> TU = TU1*Tu1;
	Eigen::Matrix<floatPrec,4,4> TU_B = TU2*Tu2;

	std::vector<Eigen::Matrix<floatPrec,4,4>> trans;
	trans.push_back(TU);
	trans.push_back(TU_B);

	return trans;

}